

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O1

JSONNode * __thiscall JSONNode::at(JSONNode *this,json_index_t pos)

{
  internalJSONNode *this_00;
  json_index_t jVar1;
  JSONNode *pJVar2;
  out_of_range *this_01;
  string *psVar3;
  
  this_00 = this->internal;
  jVar1 = 0;
  if (0xfd < (byte)(this_00->_type - 6)) {
    internalJSONNode::Fetch(this_00);
    jVar1 = this_00->Children->mysize;
  }
  if (pos < jVar1) {
    pJVar2 = operator[](this,pos);
    return pJVar2;
  }
  this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar3 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_01,(string *)psVar3);
  __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("at() out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    return (*this)[pos];
}